

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edata_cache.c
# Opt level: O0

void duckdb_je_edata_cache_put(tsdn_t *tsdn,edata_cache_t *edata_cache,edata_t *edata)

{
  long in_RSI;
  size_t newval;
  size_t oldval;
  size_t result;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  edata_avail_t *in_stack_ffffffffffffff60;
  uint in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  tsdn_t *in_stack_ffffffffffffff78;
  
  malloc_mutex_lock(in_stack_ffffffffffffff78,
                    (malloc_mutex_t *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70))
  ;
  duckdb_je_edata_avail_insert
            (in_stack_ffffffffffffff60,
             (edata_t *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  *(long *)(in_RSI + 0x10) = *(long *)(in_RSI + 0x10) + 1;
  malloc_mutex_unlock((tsdn_t *)(ulong)in_stack_ffffffffffffff70,(malloc_mutex_t *)0x0);
  return;
}

Assistant:

void
edata_cache_put(tsdn_t *tsdn, edata_cache_t *edata_cache, edata_t *edata) {
	malloc_mutex_lock(tsdn, &edata_cache->mtx);
	edata_avail_insert(&edata_cache->avail, edata);
	atomic_load_add_store_zu(&edata_cache->count, 1);
	malloc_mutex_unlock(tsdn, &edata_cache->mtx);
}